

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall CConnman::ThreadOpenAddedConnections(CConnman *this)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  duration in_RDI;
  long in_FS_OFFSET;
  AddedNodeInfo *info;
  vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_> *__range2;
  bool tried;
  iterator __end2;
  iterator __begin2;
  vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_> vInfo;
  CSemaphoreGrant grant;
  CAddress addr;
  uint in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  CSemaphore *in_stack_fffffffffffffeb0;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  type in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  CAddress *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 uVar4;
  CConnman *in_stack_fffffffffffffef8;
  long lVar5;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  CSemaphoreGrant *in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff37;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  CConnman *in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff9f;
  CConnman *in_stack_ffffffffffffffa0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar5 = in_RDI.__r;
  AssertLockNotHeldInline
            ((char *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),
             (char *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,(Mutex *)0x218f4a);
  AssertLockNotHeldInline
            ((char *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),
             (char *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,(Mutex *)0x218f6e);
  do {
    std::unique_ptr<CSemaphore,_std::default_delete<CSemaphore>_>::operator*
              ((unique_ptr<CSemaphore,_std::default_delete<CSemaphore>_> *)
               CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
    uVar4 = 0;
    CSemaphoreGrant::CSemaphoreGrant
              ((CSemaphoreGrant *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),
               in_stack_fffffffffffffeb0,SUB41((uint)in_stack_fffffffffffffeac >> 0x18,0));
    GetAddedNodeInfo(in_stack_ffffffffffffffa0,(bool)in_stack_ffffffffffffff9f);
    bVar2 = false;
    std::vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_>::begin
              ((vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_> *)in_stack_fffffffffffffeb0);
    std::vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_>::end
              ((vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_> *)in_stack_fffffffffffffeb0);
    while (bVar3 = __gnu_cxx::
                   operator==<AddedNodeInfo_*,_std::vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_>_>
                             ((__normal_iterator<AddedNodeInfo_*,_std::vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_>_>
                               *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),
                              (__normal_iterator<AddedNodeInfo_*,_std::vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_>_>
                               *)in_stack_fffffffffffffeb0), ((bVar3 ^ 0xffU) & 1) != 0) {
      in_stack_fffffffffffffef8 =
           (CConnman *)
           __gnu_cxx::
           __normal_iterator<AddedNodeInfo_*,_std::vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_>_>
           ::operator*((__normal_iterator<AddedNodeInfo_*,_std::vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_>_>
                        *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      bVar3 = CSemaphoreGrant::operator_cast_to_bool
                        ((CSemaphoreGrant *)
                         CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      if (!bVar3) break;
      bVar2 = true;
      CService::CService((CService *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      CAddress::CAddress(in_stack_fffffffffffffed8,
                         (CService *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                         (ServiceFlags)in_stack_fffffffffffffec8);
      CService::~CService((CService *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8))
      ;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      in_stack_fffffffffffffea8 =
           ((AddedNodeParams *)&in_stack_fffffffffffffef8->m_total_bytes_sent_mutex)->
           m_use_v2transport & 1;
      OpenNetworkConnection
                (in_stack_ffffffffffffff40,
                 (CAddress *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                 (bool)in_stack_ffffffffffffff37,in_stack_ffffffffffffff28,
                 (char *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 (ConnectionType)((ulong)lVar5 >> 0x20),SUB81((ulong)lVar5 >> 0x18,0));
      in_stack_fffffffffffffed8 = (CAddress *)(in_RDI.__r + 0x308);
      in_stack_ffffffffffffff3c = 500;
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                ((duration<long,_std::ratio<1L,_1000L>_> *)
                 CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),(int *)0x2190f0);
      std::chrono::duration<long,std::ratio<1l,1000000000l>>::
      duration<long,std::ratio<1l,1000l>,void>
                ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffeb0,
                 (duration<long,_std::ratio<1L,_1000L>_> *)
                 CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      in_stack_fffffffffffffed7 =
           CThreadInterrupt::sleep_for
                     ((CThreadInterrupt *)CONCAT44(uVar4,in_stack_fffffffffffffee0),in_RDI);
      bVar3 = ((in_stack_fffffffffffffed7 ^ 0xff) & 1) != 0;
      if (!bVar3) {
        in_stack_fffffffffffffec8 =
             std::unique_ptr<CSemaphore,_std::default_delete<CSemaphore>_>::operator*
                       ((unique_ptr<CSemaphore,_std::default_delete<CSemaphore>_> *)
                        CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
        CSemaphoreGrant::CSemaphoreGrant
                  ((CSemaphoreGrant *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),
                   in_stack_fffffffffffffeb0,SUB41((uint)in_stack_fffffffffffffeac >> 0x18,0));
        CSemaphoreGrant::operator=
                  ((CSemaphoreGrant *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),
                   (CSemaphoreGrant *)in_stack_fffffffffffffeb0);
        CSemaphoreGrant::~CSemaphoreGrant
                  ((CSemaphoreGrant *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8))
        ;
      }
      CAddress::~CAddress((CAddress *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8))
      ;
      if (bVar3) goto LAB_002192b5;
      __gnu_cxx::
      __normal_iterator<AddedNodeInfo_*,_std::vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_>_>
      ::operator++((__normal_iterator<AddedNodeInfo_*,_std::vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_>_>
                    *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    }
    PerformReconnections(in_stack_fffffffffffffef8);
    in_stack_ffffffffffffff24 = 2;
    if (bVar2) {
      in_stack_ffffffffffffff24 = 0x3c;
    }
    std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
              ((duration<long,_std::ratio<1L,_1L>_> *)
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),(int *)0x219266);
    std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1l>,void>
              ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffeb0,
               (duration<long,_std::ratio<1L,_1L>_> *)
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    in_stack_fffffffffffffebf =
         CThreadInterrupt::sleep_for
                   ((CThreadInterrupt *)CONCAT44(uVar4,in_stack_fffffffffffffee0),in_RDI);
    if (((in_stack_fffffffffffffebf ^ 0xff) & 1) == 0) {
      bVar3 = false;
    }
    else {
      bVar3 = true;
    }
LAB_002192b5:
    std::vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_>::~vector
              ((vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_> *)
               CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
    CSemaphoreGrant::~CSemaphoreGrant
              ((CSemaphoreGrant *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    if (bVar3) {
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return;
    }
  } while( true );
}

Assistant:

void CConnman::ThreadOpenAddedConnections()
{
    AssertLockNotHeld(m_unused_i2p_sessions_mutex);
    AssertLockNotHeld(m_reconnections_mutex);
    while (true)
    {
        CSemaphoreGrant grant(*semAddnode);
        std::vector<AddedNodeInfo> vInfo = GetAddedNodeInfo(/*include_connected=*/false);
        bool tried = false;
        for (const AddedNodeInfo& info : vInfo) {
            if (!grant) {
                // If we've used up our semaphore and need a new one, let's not wait here since while we are waiting
                // the addednodeinfo state might change.
                break;
            }
            tried = true;
            CAddress addr(CService(), NODE_NONE);
            OpenNetworkConnection(addr, false, std::move(grant), info.m_params.m_added_node.c_str(), ConnectionType::MANUAL, info.m_params.m_use_v2transport);
            if (!interruptNet.sleep_for(std::chrono::milliseconds(500))) return;
            grant = CSemaphoreGrant(*semAddnode, /*fTry=*/true);
        }
        // See if any reconnections are desired.
        PerformReconnections();
        // Retry every 60 seconds if a connection was attempted, otherwise two seconds
        if (!interruptNet.sleep_for(std::chrono::seconds(tried ? 60 : 2)))
            return;
    }
}